

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Table_ConstructFromInitList_Test::TestBody
          (Table_ConstructFromInitList_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  hasher *in_R8;
  key_equal *in_R9;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  iVar3;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  StringTable t;
  
  local_148.first._M_dataplus._M_p = (pointer)&local_148.first.field_2;
  local_148.first._M_string_length = 0;
  local_148.first.field_2._M_local_buf[0] = '\0';
  local_148.second._M_dataplus._M_p = (pointer)&local_148.second.field_2;
  local_148.second._M_string_length = 0;
  local_148.second.field_2._M_local_buf[0] = '\0';
  local_108 = local_f8;
  local_100 = 0;
  local_f8[0] = 0;
  local_e8 = local_d8;
  local_e0 = 0;
  local_d8[0] = 0;
  local_c8 = local_b8;
  local_c0 = 0;
  local_b8[0] = 0;
  local_a8 = local_98;
  local_a0 = 0;
  local_98[0] = 0;
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_178;
  local_178._M_local_buf[0] = '\0';
  _Var4._M_p = (pointer)paVar1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_88,&local_168,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffe78);
  iVar3._M_len = 4;
  iVar3._M_array = &local_148;
  StringTable::raw_hash_set(&t,iVar3,(size_t)paVar1,in_R8,in_R9,(allocator_type *)_Var4._M_p);
  lVar2 = 0xc0;
  do {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&local_148.first._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x40);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
  std::__cxx11::string::~string((string *)&local_168);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::~raw_hash_set(&t.
                   super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                 );
  return;
}

Assistant:

TEST(Group, MatchEmptyOrDeleted) {
  PHMAP_IF_CONSTEXPR (Group::kWidth == 16) {
    ctrl_t group[] = {kEmpty, 1, kDeleted, 3, kEmpty, 5, kSentinel, 7,
                      7,      5, 3,        1, 1,      1, 1,         1};
    EXPECT_THAT(Group{group}.MatchEmptyOrDeleted(), ElementsAre(0, 2, 4));
  } else PHMAP_IF_CONSTEXPR (Group::kWidth == 8) {
    ctrl_t group[] = {kEmpty, 1, 2, kDeleted, 2, 1, kSentinel, 1};
    EXPECT_THAT(Group{group}.MatchEmptyOrDeleted(), ElementsAre(0, 3));
  } else {
    FAIL() << "No test coverage for Group::kWidth==" << Group::kWidth;
  }